

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

int64_t __thiscall
TPZCompElWithMem<TPZMultiphysicsInterfaceElement>::GetGlobalIntegrationPointIndex
          (TPZCompElWithMem<TPZMultiphysicsInterfaceElement> *this,TPZMaterialData *data)

{
  int64_t iVar1;
  long *plVar2;
  long in_RSI;
  long in_RDI;
  int64_t np;
  int64_t glIntegralPt;
  undefined8 local_18;
  
  local_18 = -1;
  iVar1 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0x178));
  if ((iVar1 != 0) && (-1 < *(int *)(in_RSI + 0x48c0))) {
    plVar2 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)(in_RDI + 0x178),(long)*(int *)(in_RSI + 0x48c0));
    local_18 = *plVar2;
  }
  return local_18;
}

Assistant:

inline int64_t TPZCompElWithMem<TBASE>::GetGlobalIntegrationPointIndex(TPZMaterialData &data)
{
    int64_t glIntegralPt = -1;
    auto np = fIntPtIndices.size();
#ifdef PZDEBUG
    if(fIntPtIndices.size()==0 && data.intLocPtIndex)
    {
        std::cout << __PRETTY_FUNCTION__ << "\nInconsistent data structure intLocPtIndex "
        << data.intLocPtIndex << " no point indices ";
    }
#endif
    if (np && data.intLocPtIndex >= 0) {
        glIntegralPt = fIntPtIndices[ data.intLocPtIndex ]; // returning the
    }
    return glIntegralPt;
}